

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerThread.cxx
# Opt level: O2

shared_ptr<cmDebugger::cmDebuggerStackFrame> __thiscall
cmDebugger::cmDebuggerThread::GetTopStackFrame(cmDebuggerThread *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<cmDebugger::cmDebuggerStackFrame> sVar1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,(mutex_type *)(in_RSI + 0x78));
  if (*(long *)(in_RSI + 0x28) == *(long *)(in_RSI + 0x30)) {
    this->Id = 0;
    (this->Name)._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    std::__shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2> *)
               (*(long *)(in_RSI + 0x30) + -0x10));
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  sVar1.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cmDebugger::cmDebuggerStackFrame>)
         sVar1.super___shared_ptr<cmDebugger::cmDebuggerStackFrame,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<cmDebuggerStackFrame> cmDebuggerThread::GetTopStackFrame()
{
  std::unique_lock<std::mutex> lock(Mutex);
  if (!Frames.empty()) {
    return Frames.back();
  }

  return {};
}